

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O1

void __thiscall serial::MillisecondTimer::MillisecondTimer(MillisecondTimer *this,uint32_t millis)

{
  ulong uVar1;
  timespec time;
  timespec local_28;
  
  clock_gettime(1,&local_28);
  (this->expiry).tv_sec = local_28.tv_sec;
  (this->expiry).tv_nsec = local_28.tv_nsec;
  uVar1 = (ulong)((double)millis * 1000000.0 + (double)local_28.tv_nsec);
  if ((long)uVar1 < 1000000000) {
    (this->expiry).tv_nsec = uVar1;
  }
  else {
    (this->expiry).tv_nsec = uVar1 % 1000000000;
    (this->expiry).tv_sec = uVar1 / 1000000000 + local_28.tv_sec;
  }
  return;
}

Assistant:

MillisecondTimer::MillisecondTimer (const uint32_t millis)
  : expiry(timespec_now())
{
  int64_t tv_nsec = expiry.tv_nsec + (millis * 1e6);
  if (tv_nsec >= 1e9) {
    int64_t sec_diff = tv_nsec / static_cast<int> (1e9);
    expiry.tv_nsec = tv_nsec % static_cast<int>(1e9);
    expiry.tv_sec += sec_diff;
  } else {
    expiry.tv_nsec = tv_nsec;
  }
}